

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msg.cpp
# Opt level: O3

size_t __thiscall zmq::msg_t::size(msg_t *this)

{
  undefined8 in_RAX;
  size_t sVar1;
  uchar local_11;
  
  local_11 = (this->_u).base.type;
  if (6 < (byte)(local_11 + 0x9b)) {
    size();
    local_11 = (uchar)((ulong)in_RAX >> 0x38);
  }
  switch(local_11) {
  case 'e':
    sVar1 = (size_t)(this->_u).base.unused[0x21];
    break;
  case 'f':
  case 'i':
    sVar1 = ((this->_u).lmsg.content)->size;
    break;
  default:
    size();
    sVar1 = 0;
    break;
  case 'h':
    sVar1 = (this->_u).cmsg.size;
  }
  return sVar1;
}

Assistant:

size_t zmq::msg_t::size () const
{
    //  Check the validity of the message.
    zmq_assert (check ());

    switch (_u.base.type) {
        case type_vsm:
            return _u.vsm.size;
        case type_lmsg:
            return _u.lmsg.content->size;
        case type_zclmsg:
            return _u.zclmsg.content->size;
        case type_cmsg:
            return _u.cmsg.size;
        default:
            zmq_assert (false);
            return 0;
    }
}